

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPPacketBuilder::PrivateBuildPacket
          (RTPPacketBuilder *this,void *data,size_t len,uint8_t pt,bool mark,uint32_t timestampinc,
          bool gotextension,uint16_t hdrextID,void *hdrextdata,size_t numhdrextwords)

{
  uint16_t seqnr;
  uint32_t timestamp;
  uint32_t ssrc;
  uint8_t *buffer;
  int iVar1;
  RTPMemoryManager *mgr;
  size_t sVar2;
  RTPTime RVar3;
  undefined1 local_d8 [4];
  int status;
  RTPPacket p;
  bool gotextension_local;
  uint32_t timestampinc_local;
  bool mark_local;
  uint8_t pt_local;
  size_t len_local;
  void *data_local;
  RTPPacketBuilder *this_local;
  
  p.receivetime.m_t._7_1_ = gotextension;
  seqnr = this->seqnr;
  timestamp = this->timestamp;
  ssrc = this->ssrc;
  iVar1 = this->numcsrcs;
  sVar2 = this->maxpacksize;
  buffer = this->buffer;
  mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
  RTPPacket::RTPPacket
            ((RTPPacket *)local_d8,pt,data,len,seqnr,timestamp,ssrc,mark,(uint8_t)iVar1,this->csrcs,
             gotextension,hdrextID,(uint16_t)numhdrextwords,hdrextdata,buffer,sVar2,mgr);
  this_local._4_4_ = RTPPacket::GetCreationError((RTPPacket *)local_d8);
  if (-1 < this_local._4_4_) {
    sVar2 = RTPPacket::GetPacketLength((RTPPacket *)local_d8);
    this->packetlength = sVar2;
    if (this->numpackets == 0) {
      RVar3 = RTPTime::CurrentTime();
      (this->lastwallclocktime).m_t = RVar3.m_t;
      this->lastrtptimestamp = this->timestamp;
      this->prevrtptimestamp = this->timestamp;
    }
    else if (this->timestamp != this->prevrtptimestamp) {
      RVar3 = RTPTime::CurrentTime();
      (this->lastwallclocktime).m_t = RVar3.m_t;
      this->lastrtptimestamp = this->timestamp;
      this->prevrtptimestamp = this->timestamp;
    }
    sVar2 = RTPPacket::GetPayloadLength((RTPPacket *)local_d8);
    this->numpayloadbytes = (int)sVar2 + this->numpayloadbytes;
    this->numpackets = this->numpackets + 1;
    this->timestamp = timestampinc + this->timestamp;
    this->seqnr = this->seqnr + 1;
    this_local._4_4_ = 0;
  }
  RTPPacket::~RTPPacket((RTPPacket *)local_d8);
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::PrivateBuildPacket(const void *data,size_t len,
	                  uint8_t pt,bool mark,uint32_t timestampinc,bool gotextension,
	                  uint16_t hdrextID,const void *hdrextdata,size_t numhdrextwords)
{
	RTPPacket p(pt,data,len,seqnr,timestamp,ssrc,mark,numcsrcs,csrcs,gotextension,hdrextID,
	            (uint16_t)numhdrextwords,hdrextdata,buffer,maxpacksize,GetMemoryManager());
	int status = p.GetCreationError();

	if (status < 0)
		return status;
	packetlength = p.GetPacketLength();

	if (numpackets == 0) // first packet
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	else if (timestamp != prevrtptimestamp)
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	
	numpayloadbytes += (uint32_t)p.GetPayloadLength();
	numpackets++;
	timestamp += timestampinc;
	seqnr++;

	return 0;
}